

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cc
# Opt level: O0

uint32_t kratos::SortInitialVisitor::get_order(shared_ptr<kratos::Stmt> *stmt)

{
  StatementType SVar1;
  StatementBlockType SVar2;
  element_type *this;
  element_type *this_00;
  undefined1 local_28 [8];
  shared_ptr<kratos::StmtBlock> block;
  shared_ptr<kratos::Stmt> *stmt_local;
  
  block.super___shared_ptr<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)stmt;
  this = std::__shared_ptr_access<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
         operator->((__shared_ptr_access<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                    stmt);
  SVar1 = Stmt::type(this);
  if (SVar1 == Block) {
    std::__shared_ptr_access<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               block.super___shared_ptr<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
    Stmt::as<kratos::StmtBlock>((Stmt *)local_28);
    this_00 = std::__shared_ptr_access<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_28);
    SVar2 = StmtBlock::block_type(this_00);
    stmt_local._4_4_ = (uint32_t)(SVar2 == Initial);
    std::shared_ptr<kratos::StmtBlock>::~shared_ptr((shared_ptr<kratos::StmtBlock> *)local_28);
  }
  else {
    stmt_local._4_4_ = 0;
  }
  return stmt_local._4_4_;
}

Assistant:

static uint32_t get_order(const std::shared_ptr<Stmt>& stmt) {
        if (stmt->type() != StatementType::Block) return 0;
        auto block = stmt->as<StmtBlock>();
        if (block->block_type() != StatementBlockType::Initial) return 0;
        return 1;
    }